

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_write_built_in_constants
               (NegativeTestContext *ctx)

{
  pointer pcVar1;
  pointer pcVar2;
  RenderContext *pRVar3;
  bool bVar4;
  ContextType ctxType;
  char *__s;
  mapped_type *pmVar5;
  ShaderType extraout_EDX;
  ShaderType extraout_EDX_00;
  ShaderType SVar6;
  ShaderType extraout_EDX_01;
  ShaderType extraout_EDX_02;
  ShaderType extraout_EDX_03;
  ShaderType extraout_EDX_04;
  ShaderType extraout_EDX_05;
  ShaderType extraout_EDX_06;
  ShaderType extraout_EDX_07;
  ShaderType extraout_EDX_08;
  ShaderType extraout_EDX_09;
  ShaderType extraout_EDX_10;
  char *pcVar7;
  long lVar8;
  ShaderProgram vertProgram;
  GeometrySource geometrySource;
  TessellationEvaluationSource tessEvalSource;
  TessellationControlSource tessCtrlSource;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ShaderProgram tessCtrlProgram;
  ComputeSource computeSource;
  FragmentSource fragSource;
  VertexSource vertSource;
  ShaderProgram fragProgram;
  ShaderProgram computeProgram;
  ShaderProgram geometryProgram;
  ShaderProgram tessEvalProgram;
  undefined1 local_700 [208];
  uint local_630;
  value_type local_628;
  uint local_608;
  value_type local_600;
  uint local_5e0;
  value_type local_5d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5b8;
  undefined1 local_588 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  bool bStack_4c8;
  undefined8 uStack_4c7;
  uint local_4b8;
  value_type local_4b0;
  uint local_490;
  value_type local_488;
  uint local_468;
  value_type local_460;
  undefined1 local_440 [176];
  undefined1 local_390 [17];
  undefined8 uStack_37f;
  undefined1 local_370 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_2e0;
  undefined1 local_2c0 [24];
  bool bStack_2a8;
  undefined1 local_2a0 [176];
  undefined1 local_1f0 [17];
  undefined8 uStack_1df;
  undefined1 local_1d0 [176];
  undefined1 local_120 [17];
  undefined8 uStack_10f;
  undefined1 local_100 [176];
  undefined1 local_50 [17];
  undefined8 uStack_3f;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5b8._M_impl.super__Rb_tree_header._M_header;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5b8._M_impl.super__Rb_tree_header._M_header._M_left;
  __s = glu::getGLSLVersionDeclaration(bVar4 | GLSL_VERSION_310_ES);
  pcVar1 = local_700 + 0x10;
  local_700._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_700,"GLSL_VERSION_STRING","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_5b8,(key_type *)local_700);
  pcVar7 = (char *)pmVar5->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,pcVar7,(ulong)__s);
  if ((pointer)local_700._0_8_ != pcVar1) {
    operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
  }
  pcVar7 = "#extension GL_EXT_tessellation_shader : require";
  if (bVar4) {
    pcVar7 = "";
  }
  local_700._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_700,"GLSL_TESS_EXTENSION_STRING","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_5b8,(key_type *)local_700);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,(ulong)pcVar7);
  if ((pointer)local_700._0_8_ != pcVar1) {
    operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
  }
  local_700._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_700,"COMPUTE_BUILT_IN_CONSTANTS_STRING","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_5b8,(key_type *)local_700);
  std::__cxx11::string::_M_replace((ulong)pmVar5,0,(char *)pmVar5->_M_string_length,0x1cd7bee);
  SVar6 = extraout_EDX;
  if ((pointer)local_700._0_8_ != pcVar1) {
    operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
    SVar6 = extraout_EDX_00;
  }
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)local_588,(_anonymous_namespace_ *)0x0,SVar6);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_440,(string *)local_588);
  tcu::StringTemplate::specialize
            ((string *)local_700,(StringTemplate *)local_440,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_5b8);
  local_468 = 0;
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_460,local_700._0_8_,(pointer)(local_700._8_8_ + local_700._0_8_));
  if ((pointer)local_700._0_8_ != pcVar1) {
    operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_440);
  pcVar2 = local_588 + 0x10;
  SVar6 = extraout_EDX_01;
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    SVar6 = extraout_EDX_02;
  }
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)local_588,(_anonymous_namespace_ *)&DAT_00000001,SVar6);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_440,(string *)local_588);
  tcu::StringTemplate::specialize
            ((string *)local_700,(StringTemplate *)local_440,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_5b8);
  local_490 = 1;
  local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_488,local_700._0_8_,(pointer)(local_700._8_8_ + local_700._0_8_));
  if ((pointer)local_700._0_8_ != pcVar1) {
    operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_440);
  SVar6 = extraout_EDX_03;
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    SVar6 = extraout_EDX_04;
  }
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)local_588,(_anonymous_namespace_ *)0x3,SVar6);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_440,(string *)local_588);
  tcu::StringTemplate::specialize
            ((string *)local_700,(StringTemplate *)local_440,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_5b8);
  local_5e0 = 3;
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5d8,local_700._0_8_,(pointer)(local_700._8_8_ + local_700._0_8_));
  if ((pointer)local_700._0_8_ != pcVar1) {
    operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_440);
  SVar6 = extraout_EDX_05;
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    SVar6 = extraout_EDX_06;
  }
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)local_588,(_anonymous_namespace_ *)&DAT_00000004,SVar6);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_440,(string *)local_588);
  tcu::StringTemplate::specialize
            ((string *)local_700,(StringTemplate *)local_440,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_5b8);
  local_608 = 4;
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_600,local_700._0_8_,(pointer)(local_700._8_8_ + local_700._0_8_));
  if ((pointer)local_700._0_8_ != pcVar1) {
    operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_440);
  SVar6 = extraout_EDX_07;
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    SVar6 = extraout_EDX_08;
  }
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)local_588,(_anonymous_namespace_ *)0x2,SVar6);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_440,(string *)local_588);
  tcu::StringTemplate::specialize
            ((string *)local_700,(StringTemplate *)local_440,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_5b8);
  local_630 = 2;
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_628,local_700._0_8_,(pointer)(local_700._8_8_ + local_700._0_8_));
  if ((pointer)local_700._0_8_ != pcVar1) {
    operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_440);
  SVar6 = extraout_EDX_09;
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
    SVar6 = extraout_EDX_10;
  }
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)local_588,(_anonymous_namespace_ *)0x5,SVar6);
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_440,(string *)local_588);
  tcu::StringTemplate::specialize
            ((string *)local_700,(StringTemplate *)local_440,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_5b8);
  local_4b8 = 5;
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b0,local_700._0_8_,(pointer)(local_700._8_8_ + local_700._0_8_));
  if ((pointer)local_700._0_8_ != pcVar1) {
    operator_delete((void *)local_700._0_8_,local_700._16_8_ + 1);
  }
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_440);
  if ((pointer)local_588._0_8_ != pcVar2) {
    operator_delete((void *)local_588._0_8_,local_588._16_8_ + 1);
  }
  pRVar3 = ctx->m_renderCtx;
  local_390[0x10] = false;
  uStack_37f = 0;
  local_390._0_8_ = (pointer)0x0;
  local_390[8] = '\0';
  local_390._9_7_ = 0;
  memset(local_440,0,0xac);
  uStack_37f._7_1_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_440 + (ulong)local_468 * 0x18),&local_460);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_700,pRVar3,(ProgramSources *)local_440);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_390);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             (local_440 + 0x90));
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_440 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  pRVar3 = ctx->m_renderCtx;
  bStack_4c8 = false;
  uStack_4c7 = 0;
  local_4d8._M_allocated_capacity = 0;
  local_4d8._M_local_buf[8] = '\0';
  local_4d8._9_7_ = 0;
  memset(local_588,0,0xac);
  uStack_4c7._7_1_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_588 + (ulong)local_490 * 0x18),&local_488);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_440,pRVar3,(ProgramSources *)local_588);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_4d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_4f8);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_588 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  pRVar3 = ctx->m_renderCtx;
  local_50[0x10] = false;
  uStack_3f = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = '\0';
  local_50._9_7_ = 0;
  memset(local_100,0,0xac);
  uStack_3f._7_1_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_5e0 * 0x18),&local_5d8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_588,pRVar3,(ProgramSources *)local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             (local_100 + 0x90));
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  pRVar3 = ctx->m_renderCtx;
  local_120[0x10] = false;
  uStack_10f = 0;
  local_120._0_8_ = (pointer)0x0;
  local_120[8] = '\0';
  local_120._9_7_ = 0;
  memset(local_1d0,0,0xac);
  uStack_10f._7_1_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + (ulong)local_608 * 0x18),&local_600);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_100,pRVar3,(ProgramSources *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             (local_1d0 + 0x90));
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  pRVar3 = ctx->m_renderCtx;
  local_1f0[0x10] = false;
  uStack_1df = 0;
  local_1f0._0_8_ = (pointer)0x0;
  local_1f0[8] = '\0';
  local_1f0._9_7_ = 0;
  memset(local_2a0,0,0xac);
  uStack_1df._7_1_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2a0 + (ulong)local_630 * 0x18),&local_628);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1d0,pRVar3,(ProgramSources *)local_2a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1f0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             (local_2a0 + 0x90));
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2a0 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  pRVar3 = ctx->m_renderCtx;
  local_2c0[0x10] = 0;
  stack0xfffffffffffffd51 = 0;
  local_2c0._0_8_ = (pointer)0x0;
  local_2c0[8] = 0;
  local_2c0._9_7_ = 0;
  memset(local_370,0,0xac);
  bStack_2a8 = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_370 + (ulong)local_4b8 * 0x18),&local_4b0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2a0,pRVar3,(ProgramSources *)local_370);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2c0);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_2e0);
  lVar8 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_370 + lVar8));
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  local_370._0_8_ = local_360;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_370,
             "A compile time is generated if compute built-in constants provided in all shaders are written to."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_370);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370._0_8_ !=
      local_360) {
    operator_delete((void *)local_370._0_8_,(ulong)(local_360[0]._M_dataplus._M_p + 1));
  }
  verifyCompileError(ctx,(ShaderProgram *)local_700,SHADERTYPE_VERTEX);
  verifyCompileError(ctx,(ShaderProgram *)local_440,SHADERTYPE_FRAGMENT);
  verifyCompileError(ctx,(ShaderProgram *)local_588,SHADERTYPE_TESSELLATION_CONTROL);
  verifyCompileError(ctx,(ShaderProgram *)local_100,SHADERTYPE_TESSELLATION_EVALUATION);
  verifyCompileError(ctx,(ShaderProgram *)local_1d0,SHADERTYPE_GEOMETRY);
  verifyCompileError(ctx,(ShaderProgram *)local_2a0,SHADERTYPE_COMPUTE);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2a0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1d0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_100);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_588);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_440);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_700);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488._M_dataplus._M_p != &local_488.field_2) {
    operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_5b8);
  return;
}

Assistant:

void invalid_write_built_in_constants (NegativeTestContext& ctx)
{
	const bool					isES32			= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>			args;

	args["GLSL_VERSION_STRING"]					=	isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	args["GLSL_TESS_EXTENSION_STRING"]			=	isES32 ? "" : "#extension GL_EXT_tessellation_shader : require";
	args["COMPUTE_BUILT_IN_CONSTANTS_STRING"]	=	"	gl_MaxComputeWorkGroupCount       = ivec3(65535, 65535, 65535);\n"
													"	gl_MaxComputeWorkGroupCount       = ivec3(1024, 1024, 64);\n"
													"	gl_MaxComputeWorkGroupSize        = ivec3(512);\n"
													"	gl_MaxComputeUniformComponents    = 512;\n"
													"	gl_MaxComputeTextureImageUnits    = 16;\n"
													"	gl_MaxComputeImageUniforms        = 8;\n"
													"	gl_MaxComputeAtomicCounters       = 8;\n"
													"	gl_MaxComputeAtomicCounterBuffers = 1;\n";

	const glu::VertexSource					vertSource		(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_VERTEX)).specialize(args));
	const glu::FragmentSource				fragSource		(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_FRAGMENT)).specialize(args));
	const glu::TessellationControlSource	tessCtrlSource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_TESSELLATION_CONTROL)).specialize(args));
	const glu::TessellationEvaluationSource	tessEvalSource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_TESSELLATION_EVALUATION)).specialize(args));
	const glu::GeometrySource				geometrySource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_GEOMETRY)).specialize(args));
	const glu::ComputeSource				computeSource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_COMPUTE)).specialize(args));

	glu::ShaderProgram	vertProgram		(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << vertSource);
	glu::ShaderProgram	fragProgram		(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << fragSource);
	glu::ShaderProgram	tessCtrlProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessCtrlSource);
	glu::ShaderProgram	tessEvalProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessEvalSource);
	glu::ShaderProgram	geometryProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << geometrySource);
	glu::ShaderProgram	computeProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << computeSource);

	ctx.beginSection("A compile time is generated if compute built-in constants provided in all shaders are written to.");
	verifyCompileError(ctx, vertProgram, glu::SHADERTYPE_VERTEX);
	verifyCompileError(ctx, fragProgram, glu::SHADERTYPE_FRAGMENT);
	verifyCompileError(ctx, tessCtrlProgram, glu::SHADERTYPE_TESSELLATION_CONTROL);
	verifyCompileError(ctx, tessEvalProgram, glu::SHADERTYPE_TESSELLATION_EVALUATION);
	verifyCompileError(ctx, geometryProgram, glu::SHADERTYPE_GEOMETRY);
	verifyCompileError(ctx, computeProgram, glu::SHADERTYPE_COMPUTE);
	ctx.endSection();
}